

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O2

_Bool al_get_monitor_info(int adapter,ALLEGRO_MONITOR_INFO *info)

{
  _func__Bool_int_ALLEGRO_MONITOR_INFO_ptr *UNRECOVERED_JUMPTABLE;
  _Bool _Var1;
  int iVar2;
  ALLEGRO_SYSTEM *pAVar3;
  
  pAVar3 = al_get_system_driver();
  iVar2 = al_get_num_video_adapters();
  if (((pAVar3 != (ALLEGRO_SYSTEM *)0x0 && adapter < iVar2) &&
      (pAVar3->vt != (ALLEGRO_SYSTEM_INTERFACE *)0x0)) &&
     (UNRECOVERED_JUMPTABLE = pAVar3->vt->get_monitor_info,
     UNRECOVERED_JUMPTABLE != (_func__Bool_int_ALLEGRO_MONITOR_INFO_ptr *)0x0)) {
    _Var1 = (*UNRECOVERED_JUMPTABLE)(adapter,info);
    return _Var1;
  }
  info->x1 = 0x7fffffff;
  info->y1 = 0x7fffffff;
  info->x2 = 0x7fffffff;
  info->y2 = 0x7fffffff;
  return false;
}

Assistant:

bool al_get_monitor_info(int adapter, ALLEGRO_MONITOR_INFO *info)
{
   ALLEGRO_SYSTEM *system = al_get_system_driver();

   if (adapter < al_get_num_video_adapters()) {
      if (system && system->vt && system->vt->get_monitor_info) {
         return system->vt->get_monitor_info(adapter, info);
      }
   }

   info->x1 = info->y1 = info->x2 = info->y2 = INT_MAX;
   return false;
}